

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.hpp
# Opt level: O1

bool OpenMD::isType<double>(string *str)

{
  byte bVar1;
  istream *piVar2;
  double result;
  istringstream iss;
  istringstream local_188 [120];
  ios_base local_110 [264];
  
  std::__cxx11::istringstream::istringstream(local_188,(string *)str,_S_in);
  piVar2 = std::istream::_M_extract<double>((double *)local_188);
  bVar1 = (&piVar2->field_0x20)[(long)piVar2->_vptr_basic_istream[-3]];
  std::__cxx11::istringstream::~istringstream(local_188);
  std::ios_base::~ios_base(local_110);
  return (bVar1 & 5) == 0;
}

Assistant:

bool isType(const std::string& str) {
    T result;
    std::istringstream iss(str);
    bool ret = true;
    if (!(iss >> result)) { ret = false; }
    return ret;
  }